

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O1

StreamSep * __thiscall Hpipe::StreamSep::operator<<(StreamSep *this,char (*val) [1])

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->stream,(this->sep)._M_dataplus._M_p,(this->sep)._M_string_length);
  sVar2 = strlen(*val);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,*val,sVar2);
  return this;
}

Assistant:

StreamSep &operator<<( const T &val ) {
        *stream << sep << val;
        return *this;
    }